

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

bool __thiscall crunch::parse_mipmap_params(crunch *this,crn_mipmap_params *mip_params)

{
  bool bVar1;
  int iVar2;
  crn_uint32 cVar3;
  char *pcVar4;
  uint32 i;
  crn_mip_mode m;
  crn_mip_filter f;
  command_line_params *this_00;
  float fVar5;
  dynamic_string val;
  dynamic_string local_50;
  dynamic_string local_40;
  
  local_50.m_buf_size = 0;
  local_50.m_len = 0;
  local_50.m_pStr = (char *)0x0;
  this_00 = &this->m_params;
  bVar1 = crnlib::command_line_params::get_value_as_string(this_00,"mipMode",0,&local_50,0);
  if (bVar1) {
    m = cCRNMipModeUseSourceOrGenerateMips;
    do {
      pcVar4 = crn_get_mip_mode_name(m);
      iVar2 = crnlib::dynamic_string::compare(&local_50,pcVar4,false);
      if (iVar2 == 0) {
        mip_params->m_mode = m;
        goto LAB_0010d6d6;
      }
      m = m + cCRNMipModeUseSourceMips;
    } while (m != cCRNMipModeTotal);
    pcVar4 = "";
    if (local_50.m_pStr != (char *)0x0) {
      pcVar4 = local_50.m_pStr;
    }
    bVar1 = false;
    crnlib::console::error("Invalid MipMode: \"%s\"",pcVar4);
  }
  else {
LAB_0010d6d6:
    bVar1 = crnlib::command_line_params::get_value_as_string(this_00,"mipFilter",0,&local_50,0);
    if (bVar1) {
      f = cCRNMipFilterBox;
      do {
        pcVar4 = crn_get_mip_filter_name(f);
        crnlib::dynamic_string::dynamic_string(&local_40,pcVar4);
        iVar2 = crnlib::dynamic_string::compare(&local_50,&local_40,false);
        if ((local_40.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_40.m_pStr + -8) ^ *(uint *)(local_40.m_pStr + -4)) == 0xffffffff)) {
          crnlib::crnlib_free(local_40.m_pStr + -0x10);
        }
        if (iVar2 == 0) {
          mip_params->m_filter = f;
          if (f == cCRNMipFilterBox) {
            mip_params->m_blurriness = 1.0;
          }
          goto LAB_0010d785;
        }
        f = f + cCRNMipFilterTent;
      } while (f != cCRNMipFilterTotal);
      pcVar4 = "";
      if (local_50.m_pStr != (char *)0x0) {
        pcVar4 = local_50.m_pStr;
      }
      bVar1 = false;
      crnlib::console::error("Invalid MipFilter: \"%s\"",pcVar4);
    }
    else {
LAB_0010d785:
      fVar5 = crnlib::command_line_params::get_value_as_float
                        (this_00,"gamma",0,mip_params->m_gamma,0.1,8.0,0);
      mip_params->m_gamma = fVar5;
      mip_params->m_gamma_filtering = -(uint)(fVar5 != 1.0) & 1;
      fVar5 = crnlib::command_line_params::get_value_as_float
                        (this_00,"blurriness",0,mip_params->m_blurriness,0.01,8.0,0);
      mip_params->m_blurriness = fVar5;
      bVar1 = crnlib::command_line_params::get_value_as_bool
                        (this_00,"renormalize",0,mip_params->m_renormalize != 0);
      mip_params->m_renormalize = (uint)bVar1;
      bVar1 = crnlib::command_line_params::get_value_as_bool
                        (this_00,"rtopmip",0,mip_params->m_rtopmip != 0);
      mip_params->m_rtopmip = (uint)bVar1;
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"wrap",0,false);
      mip_params->m_tiled = (uint)bVar1;
      cVar3 = crnlib::command_line_params::get_value_as_int(this_00,"maxmips",0,0x10,1,0x10,0);
      mip_params->m_max_levels = cVar3;
      cVar3 = crnlib::command_line_params::get_value_as_int(this_00,"minmipsize",0,1,1,0x1000,0);
      mip_params->m_min_mip_size = cVar3;
      bVar1 = true;
    }
  }
  if ((local_50.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_50.m_pStr + -8) ^ *(uint *)(local_50.m_pStr + -4)) == 0xffffffff)) {
    crnlib::crnlib_free(local_50.m_pStr + -0x10);
  }
  return bVar1;
}

Assistant:

bool parse_mipmap_params(crn_mipmap_params& mip_params)
    {
        dynamic_string val;

        if (m_params.get_value_as_string("mipMode", 0, val))
        {
            uint32 i;
            for (i = 0; i < cCRNMipModeTotal; i++)
            {
                if (val == crn_get_mip_mode_name(static_cast<crn_mip_mode>(i)))
                {
                    mip_params.m_mode = static_cast<crn_mip_mode>(i);
                    break;
                }
            }
            if (i == cCRNMipModeTotal)
            {
                console::error("Invalid MipMode: \"%s\"", val.get_ptr());
                return false;
            }
        }

        if (m_params.get_value_as_string("mipFilter", 0, val))
        {
            uint32 i;
            for (i = 0; i < cCRNMipFilterTotal; i++)
            {
                if (val == dynamic_string(crn_get_mip_filter_name(static_cast<crn_mip_filter>(i))))
                {
                    mip_params.m_filter = static_cast<crn_mip_filter>(i);
                    break;
                }
            }

            if (i == cCRNMipFilterTotal)
            {
                console::error("Invalid MipFilter: \"%s\"", val.get_ptr());
                return false;
            }

            if (i == cCRNMipFilterBox)
            {
                mip_params.m_blurriness = 1.0f;
            }
        }

        mip_params.m_gamma = m_params.get_value_as_float("gamma", 0, mip_params.m_gamma, .1f, 8.0f);
        mip_params.m_gamma_filtering = (mip_params.m_gamma != 1.0f);

        mip_params.m_blurriness = m_params.get_value_as_float("blurriness", 0, mip_params.m_blurriness, .01f, 8.0f);

        mip_params.m_renormalize = m_params.get_value_as_bool("renormalize", 0, mip_params.m_renormalize != 0);
        mip_params.m_rtopmip = m_params.get_value_as_bool("rtopmip", 0, mip_params.m_rtopmip != 0);
        mip_params.m_tiled = m_params.get_value_as_bool("wrap");

        mip_params.m_max_levels = m_params.get_value_as_int("maxmips", 0, cCRNMaxLevels, 1, cCRNMaxLevels);
        mip_params.m_min_mip_size = m_params.get_value_as_int("minmipsize", 0, 1, 1, cCRNMaxLevelResolution);

        return true;
    }